

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

int Abs_ManSupport1(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  int iVar1;
  Vec_Int_t *vSupp_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 != 0) {
    Vec_IntClear(vSupp);
    Gia_ManIncrementTravId(p);
    Abs_ManSupport1_rec(p,pObj,vSupp);
    iVar1 = Vec_IntSize(vSupp);
    return iVar1;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                ,0x1da,"int Abs_ManSupport1(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

int Abs_ManSupport1( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    assert( Gia_ObjIsAnd(pObj) );
    Vec_IntClear( vSupp );
    Gia_ManIncrementTravId( p );
    Abs_ManSupport1_rec( p, pObj, vSupp );
    return Vec_IntSize(vSupp);
}